

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicKReach.cpp
# Opt level: O2

void __thiscall
DynamicKReach::resume_bfs
          (DynamicKReach *this,vertex_t s,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *dist)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  byte bVar1;
  value_type vVar2;
  uint uVar3;
  size_type sVar4;
  uint *puVar5;
  reference pvVar6;
  reference pvVar7;
  byte *pbVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  uint *nxt;
  uint *puVar10;
  ulong __n;
  
  this->back_ = 0;
  this->front_ = 0;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,(ulong)s);
  if (*pvVar6 != '?') {
    this_00 = &this->queue_;
    sVar4 = this->back_;
    this->back_ = sVar4 + 1;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,sVar4);
    *pvVar7 = s;
    while (sVar4 = this->front_, this->back_ != sVar4) {
      this->front_ = sVar4 + 1;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,sVar4);
      uVar3 = *pvVar7;
      __n = (ulong)uVar3;
      pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
      if (*pbVar8 < this->k_) {
        pvVar9 = Graph::successors(this->graph_,uVar3);
        puVar5 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar10 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start; puVar10 != puVar5;
            puVar10 = puVar10 + 1) {
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             (dist,(ulong)*puVar10);
          bVar1 = *pbVar8;
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
          if (*pbVar8 + 1 < (uint)bVar1) {
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(dist,__n);
            vVar2 = *pvVar6;
            pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               (dist,(ulong)*puVar10);
            *pvVar6 = vVar2 + '\x01';
            pvVar9 = Graph::successors(this->graph_,*puVar10);
            if ((pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish !=
                (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start) {
              uVar3 = *puVar10;
              sVar4 = this->back_;
              this->back_ = sVar4 + 1;
              pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,sVar4);
              *pvVar7 = uVar3;
            }
          }
        }
      }
    }
    return;
  }
  __assert_fail("dist.at(s) != INF8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lebdron[P]dynamic-k-reach/index/DynamicKReach.cpp"
                ,0xa2,"void DynamicKReach::resume_bfs(vertex_t, std::vector<distance_t> &)");
}

Assistant:

void DynamicKReach::resume_bfs(vertex_t s, std::vector<distance_t> &dist) {
    back_ = 0;
    front_ = 0;
    assert(dist.at(s) != INF8);
    queue_.at(back_++) = s;
    while (back_ != front_) {
        auto cur = queue_.at(front_++);
        if (dist.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph_.successors(cur)) {
            if (dist.at(nxt) <= dist.at(cur) + 1) {
                continue;
            }
            dist.at(nxt) = dist.at(cur) + 1;
            if (graph_.successors(nxt).size() > 0) {
                queue_.at(back_++) = nxt;
            }
        }
    }
}